

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O2

_Bool need_zero_prefix(uint64_t imm)

{
  ulong uVar1;
  
  do {
    uVar1 = imm;
    imm = uVar1 >> 4;
  } while (0xf < uVar1);
  return 9 < uVar1;
}

Assistant:

static bool need_zero_prefix(uint64_t imm)
{
	// find the first hex letter representing imm
	while(imm >= 0x10)
		imm >>= 4;

	if (imm < 0xa)
		return false;
	else	// this need 0 prefix
		return true;
}